

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O3

void auto_compaction_snapshots_test(void)

{
  bool bVar1;
  fdb_status fVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  __atomic_base<unsigned_long> metalen;
  size_t bodylen;
  long extraout_RDX;
  fdb_kvs_handle *pfVar6;
  fdb_kvs_handle *pfVar7;
  timeval *__tv;
  fdb_config *fconfig;
  char *pcVar8;
  fdb_kvs_handle **ppfVar9;
  uint uVar10;
  uint uVar11;
  fdb_kvs_handle *unaff_RBP;
  fdb_kvs_handle *pfVar12;
  fdb_kvs_handle *pfVar13;
  ulong uVar14;
  fdb_kvs_handle *pfVar15;
  char *pcVar16;
  fdb_kvs_handle **ppfVar17;
  fdb_kvs_handle *unaff_R12;
  fdb_kvs_handle *unaff_R13;
  btree *doc;
  filemgr_ops *pfVar18;
  fdb_config *fconfig_00;
  fdb_kvs_handle **__s;
  fdb_kvs_handle *unaff_R15;
  fdb_doc *rdoc;
  fdb_kvs_handle *snapshot;
  fdb_kvs_handle *kvs;
  fdb_file_handle *file;
  int num_compactions;
  char str [64];
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_kvs_info info;
  fdb_kvs_handle *pfStack_3360;
  fdb_kvs_handle *pfStack_3358;
  fdb_file_handle *pfStack_3350;
  fdb_iterator *pfStack_3348;
  fdb_doc *pfStack_3340;
  fdb_kvs_handle *pfStack_3338;
  timeval tStack_3330;
  fdb_kvs_config fStack_3320;
  fdb_config fStack_3308;
  fdb_config *pfStack_3210;
  fdb_kvs_handle *pfStack_3208;
  fdb_kvs_handle *pfStack_3200;
  fdb_file_handle *pfStack_31f8;
  fdb_kvs_handle *pfStack_31f0;
  char acStack_31e7 [15];
  filemgr *pfStack_31d8;
  docio_handle *pdStack_31d0;
  btreeblk_handle *pbStack_31c8;
  size_t sStack_31c0;
  filemgr *pfStack_31b8;
  docio_handle *pdStack_31b0;
  btreeblk_handle *pbStack_31a8;
  timeval tStack_31a0;
  undefined1 auStack_3190 [76];
  uint uStack_3144;
  char *pcStack_3050;
  atomic<unsigned_long> aStack_3048;
  btree *pbStack_3040;
  fdb_kvs_handle *pfStack_3038;
  fdb_kvs_handle *pfStack_3030;
  code *pcStack_3028;
  uint uStack_3014;
  fdb_txn *pfStack_3010;
  fdb_kvs_handle *pfStack_3008;
  fdb_iterator *pfStack_3000;
  fdb_snapshot_info_t *pfStack_2ff8;
  int iStack_2fec;
  fdb_kvs_handle *pfStack_2fe8;
  fdb_kvs_handle *apfStack_2fe0 [3];
  uint64_t uStack_2fc8;
  fdb_kvs_config fStack_2fc0;
  char acStack_2fa8 [8];
  timeval tStack_2fa0;
  char acStack_2f90 [256];
  btree bStack_2e90;
  char acStack_2e40 [256];
  char acStack_2d40 [256];
  fdb_config fStack_2c40;
  fdb_kvs_handle **ppfStack_2b48;
  fdb_kvs_handle **ppfStack_2b40;
  fdb_kvs_handle *pfStack_2b38;
  fdb_kvs_handle **ppfStack_2b30;
  fdb_kvs_handle *pfStack_2b28;
  code *pcStack_2b20;
  fdb_kvs_handle **ppfStack_2b18;
  fdb_kvs_handle *pfStack_2b10;
  fdb_kvs_handle *apfStack_2b08 [9];
  fdb_kvs_config fStack_2ac0;
  timeval tStack_2aa8;
  fdb_kvs_handle *apfStack_2a98 [33];
  fdb_config fStack_2990;
  fdb_kvs_handle *apfStack_2898 [32];
  fdb_kvs_handle *apfStack_2798 [32];
  fdb_kvs_handle afStack_2698 [15];
  fdb_config *pfStack_690;
  fdb_kvs_handle *pfStack_688;
  fdb_kvs_handle *pfStack_680;
  fdb_config *pfStack_678;
  fdb_kvs_handle *pfStack_670;
  fdb_kvs_handle *pfStack_668;
  fdb_kvs_handle *pfStack_658;
  fdb_file_handle *pfStack_650;
  fdb_iterator *pfStack_648;
  fdb_doc *pfStack_640;
  fdb_kvs_handle *pfStack_638;
  undefined1 auStack_62f [31];
  undefined1 auStack_610 [72];
  fdb_config fStack_5c8;
  timeval *ptStack_4d0;
  fdb_kvs_handle *pfStack_4c8;
  fdb_kvs_handle *pfStack_4c0;
  fdb_config *pfStack_4b8;
  fdb_kvs_handle *pfStack_4b0;
  fdb_kvs_handle *pfStack_4a0;
  fdb_file_handle *pfStack_498;
  undefined4 uStack_48c;
  pthread_t pStack_488;
  undefined1 auStack_47f [63];
  undefined1 auStack_440 [16];
  uint64_t uStack_430;
  fdb_config fStack_348;
  fdb_kvs_handle *pfStack_248;
  fdb_kvs_handle *pfStack_240;
  filemgr_ops *pfStack_238;
  fdb_kvs_handle *pfStack_230;
  fdb_kvs_handle *pfStack_228;
  timeval tStack_218;
  fdb_kvs_handle *pfStack_208;
  fdb_kvs_handle *pfStack_200;
  fdb_kvs_handle *local_1f0;
  undefined1 local_1e8 [16];
  fdb_file_handle *local_1d8;
  undefined1 local_1cc [4];
  undefined1 local_1c8 [80];
  __atomic_base<unsigned_long> local_178;
  btreeblk_handle *pbStack_170;
  __atomic_base<unsigned_long> local_168;
  fdb_kvs_info local_158;
  undefined1 local_108;
  undefined1 local_fa;
  btree *local_f0;
  code *local_d0;
  fdb_encryption_algorithm_t local_c8;
  filemgr_ops *local_c0;
  
  pfStack_200 = (fdb_kvs_handle *)0x11b845;
  gettimeofday((timeval *)(local_1c8 + 0x40),(__timezone_ptr_t)0x0);
  pfStack_200 = (fdb_kvs_handle *)0x11b84a;
  memleak_start();
  pfVar18 = (filemgr_ops *)local_1cc;
  local_1cc = (undefined1  [4])0x0;
  pfStack_200 = (fdb_kvs_handle *)0x11b862;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar7 = (fdb_kvs_handle *)&stack0xfffffffffffffed8;
  pfStack_200 = (fdb_kvs_handle *)0x11b872;
  fdb_get_default_config();
  local_fa = 1;
  local_108 = 1;
  local_d0 = compaction_cb_count;
  local_c8 = 0x20;
  local_f0 = (btree *)0x1;
  pfVar15 = (fdb_kvs_handle *)0x155054;
  pfStack_200 = (fdb_kvs_handle *)0x11b8ac;
  local_c0 = pfVar18;
  fVar2 = fdb_open(&local_1d8,"mvcc_test1",(fdb_config *)pfVar7);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfVar7 = (fdb_kvs_handle *)local_1c8;
    pfStack_200 = (fdb_kvs_handle *)0x11b8c1;
    fdb_get_default_kvs_config();
    local_168._M_i = local_1c8._16_8_;
    local_178._M_i = local_1c8._0_8_;
    pbStack_170 = (btreeblk_handle *)local_1c8._8_8_;
    pfVar15 = (fdb_kvs_handle *)(local_1e8 + 8);
    pfStack_200 = (fdb_kvs_handle *)0x11b8e6;
    fVar2 = fdb_kvs_open_default(local_1d8,(fdb_kvs_handle **)pfVar15,(fdb_kvs_config *)&local_178);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbcd;
    unaff_R13 = (fdb_kvs_handle *)0x155958;
    unaff_R12 = (fdb_kvs_handle *)0x0;
    do {
      unaff_R15 = (fdb_kvs_handle *)0xcccccccd;
      pfVar12 = (fdb_kvs_handle *)0x1555bd;
      pfVar15 = (fdb_kvs_handle *)local_1c8;
      iVar4 = (int)unaff_R12;
      pfStack_200 = (fdb_kvs_handle *)0x11b91a;
      sprintf((char *)pfVar15,"%d",unaff_R12);
      pfVar6 = (fdb_kvs_handle *)local_1e8._8_8_;
      pfStack_200 = (fdb_kvs_handle *)0x11b927;
      sVar5 = strlen((char *)pfVar15);
      pfStack_200 = (fdb_kvs_handle *)0x11b93e;
      fVar2 = fdb_set_kv(pfVar6,pfVar15,sVar5,"value",5);
      pfVar13 = unaff_R13;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_200 = (fdb_kvs_handle *)0x11bb86;
        auto_compaction_snapshots_test();
LAB_0011bb86:
        pfStack_200 = (fdb_kvs_handle *)0x11bb8b;
        auto_compaction_snapshots_test();
LAB_0011bb8b:
        pfVar7 = pfVar6;
        pfStack_200 = (fdb_kvs_handle *)0x11bb90;
        auto_compaction_snapshots_test();
LAB_0011bb90:
        pfStack_200 = (fdb_kvs_handle *)0x11bb95;
        auto_compaction_snapshots_test();
LAB_0011bb95:
        pfStack_200 = (fdb_kvs_handle *)0x11bb9a;
        auto_compaction_snapshots_test();
        unaff_R13 = pfVar13;
        pfVar6 = unaff_R15;
LAB_0011bb9a:
        pfVar13 = unaff_R13;
        unaff_R13 = pfVar12;
        pfStack_200 = (fdb_kvs_handle *)0x11bb9f;
        auto_compaction_snapshots_test();
LAB_0011bb9f:
        pfStack_200 = (fdb_kvs_handle *)0x11bbac;
        auto_compaction_snapshots_test();
LAB_0011bbac:
        pfStack_200 = (fdb_kvs_handle *)0x11bbb9;
        pfVar15 = pfVar7;
        auto_compaction_snapshots_test();
LAB_0011bbb9:
        pfStack_200 = (fdb_kvs_handle *)0x11bbbe;
        auto_compaction_snapshots_test();
        unaff_RBP = unaff_R13;
        unaff_R15 = pfVar6;
LAB_0011bbbe:
        unaff_R13 = pfVar13;
        pfStack_200 = (fdb_kvs_handle *)0x11bbc3;
        auto_compaction_snapshots_test();
LAB_0011bbc3:
        pfVar18 = (filemgr_ops *)local_1c8;
        pfStack_200 = (fdb_kvs_handle *)0x11bbc8;
        auto_compaction_snapshots_test();
        goto LAB_0011bbc8;
      }
      pfVar6 = unaff_R12;
      if ((int)((ulong)unaff_R12 / 10) * 10 == iVar4) {
        pfVar15 = (fdb_kvs_handle *)0x0;
        pfStack_200 = (fdb_kvs_handle *)0x11b96a;
        fVar2 = fdb_commit(local_1d8,'\0');
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb86;
      }
      pfVar7 = unaff_R12;
      if ((int)((ulong)unaff_R12 / 100) * 100 == iVar4) {
        pfStack_200 = (fdb_kvs_handle *)0x11b99b;
        fVar2 = fdb_get_kvs_info((fdb_kvs_handle *)local_1e8._8_8_,&local_158);
        pfVar7 = (fdb_kvs_handle *)local_158.last_seqnum;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb8b;
        pfStack_200 = (fdb_kvs_handle *)0x11b9bd;
        fVar2 = fdb_snapshot_open((fdb_kvs_handle *)local_1e8._8_8_,(fdb_kvs_handle **)local_1e8,
                                  local_158.last_seqnum);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb95;
        pfStack_200 = (fdb_kvs_handle *)0x11b9e3;
        fdb_doc_create((fdb_doc **)&local_1f0,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        local_1f0->fhandle = (fdb_file_handle *)pfVar7;
        pfStack_200 = (fdb_kvs_handle *)0x11b9f6;
        fVar2 = fdb_get_byseq((fdb_kvs_handle *)local_1e8._0_8_,(fdb_doc *)local_1f0);
        pfVar13 = local_1f0;
        pfVar6 = unaff_R15;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb9a;
        unaff_R15 = (fdb_kvs_handle *)local_1f0->op_stats;
        pfStack_200 = (fdb_kvs_handle *)0x11ba17;
        sVar5 = strlen(local_1c8);
        pfStack_200 = (fdb_kvs_handle *)0x11ba25;
        iVar3 = bcmp(unaff_R15,local_1c8,sVar5);
        pfVar6 = unaff_R15;
        if (iVar3 != 0) goto LAB_0011bb9f;
        pfStack_200 = (fdb_kvs_handle *)0x11ba35;
        fdb_doc_free((fdb_doc *)pfVar13);
        pfStack_200 = (fdb_kvs_handle *)0x11ba3f;
        fVar2 = fdb_kvs_close((fdb_kvs_handle *)local_1e8._0_8_);
        pfVar12 = unaff_R13;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb90;
        pfVar15 = (fdb_kvs_handle *)local_1e8;
        pfStack_200 = (fdb_kvs_handle *)0x11ba5d;
        fVar2 = fdb_snapshot_open((fdb_kvs_handle *)local_1e8._8_8_,(fdb_kvs_handle **)pfVar15,
                                  0xffffffffffffffff);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbb9;
        pfStack_200 = (fdb_kvs_handle *)0x11ba83;
        fdb_doc_create((fdb_doc **)&local_1f0,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        local_1f0->fhandle = (fdb_file_handle *)pfVar7;
        pfStack_200 = (fdb_kvs_handle *)0x11ba96;
        pfVar15 = local_1f0;
        fVar2 = fdb_get_byseq((fdb_kvs_handle *)local_1e8._0_8_,(fdb_doc *)local_1f0);
        pfVar6 = local_1f0;
        unaff_RBP = unaff_R13;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbbe;
        pfVar7 = (fdb_kvs_handle *)local_1f0->op_stats;
        pfVar15 = (fdb_kvs_handle *)local_1c8;
        pfStack_200 = (fdb_kvs_handle *)0x11bab4;
        sVar5 = strlen((char *)pfVar15);
        pfStack_200 = (fdb_kvs_handle *)0x11bac2;
        iVar3 = bcmp(pfVar7,pfVar15,sVar5);
        if (iVar3 != 0) goto LAB_0011bbac;
        pfStack_200 = (fdb_kvs_handle *)0x11bad2;
        fdb_doc_free((fdb_doc *)pfVar6);
        pfStack_200 = (fdb_kvs_handle *)0x11badc;
        fVar2 = fdb_kvs_close((fdb_kvs_handle *)local_1e8._0_8_);
        unaff_R15 = (fdb_kvs_handle *)0xcccccccd;
        unaff_RBP = (fdb_kvs_handle *)0x1555bd;
        if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011baf4;
        goto LAB_0011bbc3;
      }
LAB_0011baf4:
      pfVar18 = (filemgr_ops *)local_1c8;
      unaff_R15 = (fdb_kvs_handle *)0xcccccccd;
      unaff_RBP = (fdb_kvs_handle *)0x1555bd;
      unaff_R12 = (fdb_kvs_handle *)(ulong)(iVar4 + 1U);
    } while (iVar4 + 1U != 100000);
    pfStack_200 = (fdb_kvs_handle *)0x11bb0e;
    fVar2 = fdb_close(local_1d8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbd2;
    pfStack_200 = (fdb_kvs_handle *)0x11bb1b;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_200 = (fdb_kvs_handle *)0x11bb28;
      memleak_end();
      pfStack_200 = (fdb_kvs_handle *)0x11bb42;
      sprintf(local_1c8,"auto compaction completed %d times with snapshots",(ulong)(uint)local_1cc);
      pcVar16 = "%s PASSED\n";
      if (auto_compaction_snapshots_test()::__test_pass != '\0') {
        pcVar16 = "%s FAILED\n";
      }
      pfStack_200 = (fdb_kvs_handle *)0x11bb6f;
      fprintf(_stderr,pcVar16,local_1c8);
      return;
    }
  }
  else {
LAB_0011bbc8:
    pfStack_200 = (fdb_kvs_handle *)0x11bbcd;
    auto_compaction_snapshots_test();
LAB_0011bbcd:
    pfStack_200 = (fdb_kvs_handle *)0x11bbd2;
    auto_compaction_snapshots_test();
LAB_0011bbd2:
    pfStack_200 = (fdb_kvs_handle *)0x11bbd7;
    auto_compaction_snapshots_test();
  }
  pfStack_200 = (fdb_kvs_handle *)compaction_cb_count;
  auto_compaction_snapshots_test();
  pfVar13 = (fdb_kvs_handle *)((ulong)pfVar15 & 0xffffffff);
  __tv = &tStack_218;
  pfStack_228 = (fdb_kvs_handle *)0x11bbf3;
  pfStack_208 = pfVar7;
  pfStack_200 = unaff_RBP;
  gettimeofday(__tv,(__timezone_ptr_t)0x0);
  if ((int)pfVar15 == 0x20) {
    if (extraout_RDX == 0) {
      *(int *)&local_1f0->kvs_config = *(int *)&local_1f0->kvs_config + 1;
      return;
    }
  }
  else {
    pfStack_228 = (fdb_kvs_handle *)0x11bc12;
    compaction_cb_count();
  }
  pfStack_228 = (fdb_kvs_handle *)rollback_during_ops_test;
  compaction_cb_count();
  pfStack_4b0 = (fdb_kvs_handle *)0x11bc37;
  pfStack_248 = unaff_R12;
  pfStack_240 = unaff_R13;
  pfStack_238 = pfVar18;
  pfStack_230 = unaff_R15;
  pfStack_228 = pfVar13;
  gettimeofday((timeval *)(auStack_47f + 0x2f),(__timezone_ptr_t)0x0);
  pfStack_4b0 = (fdb_kvs_handle *)0x11bc3c;
  memleak_start();
  uStack_48c = 10000;
  if (__tv != (timeval *)0x0) goto LAB_0011bfb5;
  pfStack_4b0 = (fdb_kvs_handle *)0x11bc59;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_4b0 = (fdb_kvs_handle *)0x11bc66;
  fdb_get_default_config();
  fconfig_00 = &fStack_348;
  pfStack_4b0 = (fdb_kvs_handle *)0x11bc7e;
  memcpy(fconfig_00,auStack_440,0xf8);
  fStack_348.block_reusing_threshold = 0;
  pfStack_4b0 = (fdb_kvs_handle *)0x11bc9d;
  fVar2 = fdb_open(&pfStack_498,"mvcc_test1",fconfig_00);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_4b0 = (fdb_kvs_handle *)0x11bcb2;
    fdb_get_default_kvs_config();
    auStack_47f._39_8_ = uStack_430;
    auStack_47f._23_8_ = auStack_440._0_8_;
    auStack_47f._31_8_ = auStack_440._8_8_;
    pfStack_4b0 = (fdb_kvs_handle *)0x11bcd4;
    fVar2 = fdb_kvs_open_default(pfStack_498,&pfStack_4a0,(fdb_kvs_config *)(auStack_47f + 0x17));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0df;
    unaff_R13 = (fdb_kvs_handle *)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
    __tv = (timeval *)0x1;
    uVar11 = 0;
    do {
      uVar10 = uVar11 + 1;
      pfVar13 = (fdb_kvs_handle *)(ulong)uVar10;
      pfStack_4b0 = (fdb_kvs_handle *)0x11bd03;
      sprintf(auStack_47f,"%d",pfVar13);
      unaff_R12 = pfStack_4a0;
      pfStack_4b0 = (fdb_kvs_handle *)0x11bd10;
      sVar5 = strlen(auStack_47f);
      pfStack_4b0 = (fdb_kvs_handle *)0x11bd2b;
      fVar2 = fdb_set_kv(unaff_R12,auStack_47f,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_4b0 = (fdb_kvs_handle *)0x11bfab;
        rollback_during_ops_test();
        goto LAB_0011bfab;
      }
      if ((int)((ulong)__tv / 10) * 10 - 1U == uVar11) {
        unaff_R13 = (fdb_kvs_handle *)((ulong)unaff_R13 ^ 1);
        pfStack_4b0 = (fdb_kvs_handle *)0x11bd66;
        fdb_commit(pfStack_498,(fdb_commit_opt_t)unaff_R13);
      }
      __tv = (timeval *)(ulong)((int)__tv + 1);
      uVar11 = uVar10;
    } while (uVar10 < 10000);
    pfVar13 = (fdb_kvs_handle *)0x1;
    pfStack_4b0 = (fdb_kvs_handle *)0x11bd8b;
    fdb_commit(pfStack_498,'\x01');
    pfStack_4b0 = (fdb_kvs_handle *)0x11bd9a;
    fdb_get_kvs_info(pfStack_4a0,(fdb_kvs_info *)auStack_440);
    __tv = (timeval *)(auStack_440 + 8);
    if ((fdb_config *)auStack_440._8_8_ != (fdb_config *)0x2710) {
      pfStack_4b0 = (fdb_kvs_handle *)0x11bdb0;
      rollback_during_ops_test();
    }
    pfStack_4b0 = (fdb_kvs_handle *)0x11bdc8;
    pthread_create(&pStack_488,(pthread_attr_t *)0x0,rollback_during_ops_test,&uStack_48c);
    fconfig_00 = (fdb_config *)0x155958;
    unaff_R15 = (fdb_kvs_handle *)auStack_47f;
    unaff_R12 = (fdb_kvs_handle *)0x1555bd;
    do {
      pfStack_4b0 = (fdb_kvs_handle *)0x11bdea;
      sprintf((char *)unaff_R15,"%d",pfVar13);
      unaff_R13 = pfStack_4a0;
      pfStack_4b0 = (fdb_kvs_handle *)0x11bdf7;
      sVar5 = strlen((char *)unaff_R15);
      pfStack_4b0 = (fdb_kvs_handle *)0x11be0e;
      fVar2 = fdb_set_kv(unaff_R13,unaff_R15,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) {
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfab;
        pfStack_4b0 = (fdb_kvs_handle *)0x11be2a;
        fVar2 = fdb_commit(pfStack_498,'\x01');
        if ((fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) && (fVar2 != FDB_RESULT_SUCCESS))
        goto LAB_0011bfb0;
      }
      uVar11 = (int)pfVar13 + 1;
      pfVar13 = (fdb_kvs_handle *)(ulong)uVar11;
    } while (uVar11 != 0x2711);
    pfStack_4b0 = (fdb_kvs_handle *)0x11be50;
    pthread_join(pStack_488,(void **)(auStack_47f + 0xf));
    pfStack_4b0 = (fdb_kvs_handle *)0x11be73;
    fVar2 = fdb_set_kv(pfStack_4a0,"key1",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0e4;
    pfStack_4b0 = (fdb_kvs_handle *)0x11be8a;
    fVar2 = fdb_commit(pfStack_498,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0e9;
    pfStack_4b0 = (fdb_kvs_handle *)0x11bea4;
    fdb_get_kvs_info(pfStack_4a0,(fdb_kvs_info *)auStack_440);
    fconfig_00 = (fdb_config *)auStack_440._8_8_;
    pfStack_4b0 = (fdb_kvs_handle *)0x11becb;
    fVar2 = fdb_set_kv(pfStack_4a0,"key2",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0ee;
    pfStack_4b0 = (fdb_kvs_handle *)0x11bef6;
    fVar2 = fdb_set_kv(pfStack_4a0,"key3",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0f3;
    pfStack_4b0 = (fdb_kvs_handle *)0x11bf0d;
    fVar2 = fdb_commit(pfStack_498,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0f8;
    pfStack_4b0 = (fdb_kvs_handle *)0x11bf22;
    fVar2 = fdb_rollback(&pfStack_4a0,(fdb_seqnum_t)fconfig_00);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_4b0 = (fdb_kvs_handle *)0x11bf3c;
      fdb_get_kvs_info(pfStack_4a0,(fdb_kvs_info *)auStack_440);
      if ((fdb_config *)auStack_440._8_8_ != fconfig_00) {
        pfStack_4b0 = (fdb_kvs_handle *)0x11bf4d;
        rollback_during_ops_test();
      }
      pfStack_4b0 = (fdb_kvs_handle *)0x11bf57;
      fdb_close(pfStack_498);
      pfStack_4b0 = (fdb_kvs_handle *)0x11bf5c;
      fdb_shutdown();
      pfStack_4b0 = (fdb_kvs_handle *)0x11bf61;
      memleak_end();
      pcVar16 = "%s PASSED\n";
      if (rollback_during_ops_test(void*)::__test_pass != '\0') {
        pcVar16 = "%s FAILED\n";
      }
      pfStack_4b0 = (fdb_kvs_handle *)0x11bf92;
      fprintf(_stderr,pcVar16,"rollback during ops test");
      return;
    }
  }
  else {
    pfStack_4b0 = (fdb_kvs_handle *)0x11c0df;
    rollback_during_ops_test();
LAB_0011c0df:
    __tv = (timeval *)auStack_440;
    pfStack_4b0 = (fdb_kvs_handle *)0x11c0e4;
    rollback_during_ops_test();
LAB_0011c0e4:
    pfStack_4b0 = (fdb_kvs_handle *)0x11c0e9;
    rollback_during_ops_test();
LAB_0011c0e9:
    pfStack_4b0 = (fdb_kvs_handle *)0x11c0ee;
    rollback_during_ops_test();
LAB_0011c0ee:
    pfStack_4b0 = (fdb_kvs_handle *)0x11c0f3;
    rollback_during_ops_test();
LAB_0011c0f3:
    pfStack_4b0 = (fdb_kvs_handle *)0x11c0f8;
    rollback_during_ops_test();
LAB_0011c0f8:
    pfStack_4b0 = (fdb_kvs_handle *)0x11c0fd;
    rollback_during_ops_test();
  }
  pfStack_4b0 = (fdb_kvs_handle *)0x11c102;
  rollback_during_ops_test();
LAB_0011c102:
  pfStack_4b0 = (fdb_kvs_handle *)0x11c107;
  rollback_during_ops_test();
  goto LAB_0011c107;
LAB_0011c3a8:
  pfStack_668 = (fdb_kvs_handle *)0x11c3ad;
  in_memory_snapshot_rollback_test();
  goto LAB_0011c3ad;
LAB_0011c7bd:
  pcStack_2b20 = (code *)0x11c7c2;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7c2:
  pcStack_2b20 = (code *)0x11c7c7;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7c7:
  pcStack_2b20 = (code *)0x11c7cc;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7cc:
  pcStack_2b20 = (code *)0x11c7d1;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7d1:
  pcStack_2b20 = (code *)0x11c7d6;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7d6:
  pcStack_2b20 = (code *)0x11c7db;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7db:
  pcStack_2b20 = (code *)0x11c7e0;
  rollback_drop_multi_files_kvs_test();
  goto LAB_0011c7e0;
LAB_0011cd0f:
  pcStack_3028 = (code *)0x11cd14;
  rollback_without_seqtree();
  goto LAB_0011cd14;
LAB_0011d0a5:
  pfStack_3200 = (fdb_kvs_handle *)0x11d0aa;
  tx_crash_recover_test();
LAB_0011d0aa:
  pfStack_3200 = (fdb_kvs_handle *)0x11d0af;
  tx_crash_recover_test();
  goto LAB_0011d0af;
LAB_0011bfab:
  pfStack_4b0 = (fdb_kvs_handle *)0x11bfb0;
  rollback_during_ops_test();
LAB_0011bfb0:
  pfStack_4b0 = (fdb_kvs_handle *)0x11bfb5;
  rollback_during_ops_test();
LAB_0011bfb5:
  fconfig_00 = (fdb_config *)auStack_440;
  pfStack_4b0 = (fdb_kvs_handle *)0x11bfc2;
  fdb_get_default_config();
  unaff_R15 = (fdb_kvs_handle *)&fStack_348;
  pfStack_4b0 = (fdb_kvs_handle *)0x11bfda;
  memcpy(unaff_R15,fconfig_00,0xf8);
  fStack_348.block_reusing_threshold = 0;
  pfStack_4b0 = (fdb_kvs_handle *)0x11bff9;
  fVar2 = fdb_open(&pfStack_498,"mvcc_test1",(fdb_config *)unaff_R15);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c102;
  fconfig_00 = (fdb_config *)auStack_440;
  pfStack_4b0 = (fdb_kvs_handle *)0x11c00e;
  fdb_get_default_kvs_config();
  auStack_47f._39_8_ = uStack_430;
  auStack_47f._23_8_ = auStack_440._0_8_;
  auStack_47f._31_8_ = auStack_440._8_8_;
  pfStack_4b0 = (fdb_kvs_handle *)0x11c031;
  fVar2 = fdb_kvs_open_default(pfStack_498,&pfStack_4a0,(fdb_kvs_config *)(auStack_47f + 0x17));
  if (fVar2 == FDB_RESULT_SUCCESS) {
    __tv = (timeval *)(long)(int)__tv->tv_sec;
    if (1 < (long)__tv) {
      unaff_R13 = (fdb_kvs_handle *)0xcccccccd;
      fconfig_00 = (fdb_config *)0x155958;
      unaff_R15 = (fdb_kvs_handle *)auStack_47f;
      unaff_R12 = (fdb_kvs_handle *)0x1555bd;
      do {
        pfStack_4b0 = (fdb_kvs_handle *)0x11c06e;
        sprintf((char *)unaff_R15,"%d",(ulong)__tv & 0xffffffff);
        pfVar13 = pfStack_4a0;
        pfStack_4b0 = (fdb_kvs_handle *)0x11c07b;
        sVar5 = strlen((char *)unaff_R15);
        pfStack_4b0 = (fdb_kvs_handle *)0x11c092;
        fVar2 = fdb_set_kv(pfVar13,unaff_R15,sVar5,"value",5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c10c;
        if ((int)(((ulong)__tv & 0xffffffff) / 10) * -10 + (int)__tv == 0) {
          pfStack_4b0 = (fdb_kvs_handle *)0x11c0b8;
          fVar2 = fdb_rollback(&pfStack_4a0,(fdb_seqnum_t)__tv);
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c111;
        }
        bVar1 = 2 < (long)__tv;
        __tv = (timeval *)((long)&__tv[-1].tv_usec + 7);
      } while (bVar1);
    }
    pfStack_4b0 = (fdb_kvs_handle *)0x11c0d3;
    fdb_close(pfStack_498);
    pfStack_4b0 = (fdb_kvs_handle *)0x11c0da;
    pthread_exit((void *)0x0);
  }
LAB_0011c107:
  pfStack_4b0 = (fdb_kvs_handle *)0x11c10c;
  rollback_during_ops_test();
LAB_0011c10c:
  pfStack_4b0 = (fdb_kvs_handle *)0x11c111;
  rollback_during_ops_test();
LAB_0011c111:
  pfStack_4b0 = (fdb_kvs_handle *)in_memory_snapshot_rollback_test;
  rollback_during_ops_test();
  pfStack_668 = (fdb_kvs_handle *)0x11c132;
  ptStack_4d0 = __tv;
  pfStack_4c8 = unaff_R12;
  pfStack_4c0 = unaff_R13;
  pfStack_4b8 = fconfig_00;
  pfStack_4b0 = unaff_R15;
  gettimeofday((timeval *)(auStack_62f + 0xf),(__timezone_ptr_t)0x0);
  pfStack_668 = (fdb_kvs_handle *)0x11c137;
  memleak_start();
  pfStack_668 = (fdb_kvs_handle *)0x11c143;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig = &fStack_5c8;
  pfStack_668 = (fdb_kvs_handle *)0x11c153;
  fdb_get_default_config();
  pfStack_668 = (fdb_kvs_handle *)0x11c167;
  fVar2 = fdb_open(&pfStack_650,"mvcc_test1",fconfig);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fconfig = (fdb_config *)(auStack_610 + 0x30);
    pfStack_668 = (fdb_kvs_handle *)0x11c17f;
    fdb_get_default_kvs_config();
    pfStack_668 = (fdb_kvs_handle *)0x11c191;
    fVar2 = fdb_kvs_open_default(pfStack_650,&pfStack_658,(fdb_kvs_config *)fconfig);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3b2;
    fconfig = (fdb_config *)0x1;
    fconfig_00 = (fdb_config *)0x155958;
    unaff_R15 = (fdb_kvs_handle *)auStack_62f;
    unaff_R12 = (fdb_kvs_handle *)0x1555bd;
    do {
      pfStack_668 = (fdb_kvs_handle *)0x11c1c0;
      sprintf((char *)unaff_R15,"%d",fconfig);
      unaff_R13 = pfStack_658;
      pfStack_668 = (fdb_kvs_handle *)0x11c1cd;
      sVar5 = strlen((char *)unaff_R15);
      pfStack_668 = (fdb_kvs_handle *)0x11c1e4;
      fVar2 = fdb_set_kv(unaff_R13,unaff_R15,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_668 = (fdb_kvs_handle *)0x11c3a8;
        in_memory_snapshot_rollback_test();
        goto LAB_0011c3a8;
      }
      uVar11 = (int)fconfig + 1;
      fconfig = (fdb_config *)(ulong)uVar11;
    } while (uVar11 != 4);
    pfStack_668 = (fdb_kvs_handle *)0x11c1ff;
    fdb_commit(pfStack_650,'\0');
    pfStack_668 = (fdb_kvs_handle *)0x11c222;
    fVar2 = fdb_set_kv(pfStack_658,"key4",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3b7;
    pfStack_668 = (fdb_kvs_handle *)0x11c24d;
    fVar2 = fdb_set_kv(pfStack_658,"key5",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3bc;
    pfStack_668 = (fdb_kvs_handle *)0x11c264;
    fVar2 = fdb_commit(pfStack_650,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3c1;
    pfStack_668 = (fdb_kvs_handle *)0x11c27b;
    fVar2 = fdb_rollback(&pfStack_658,3);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3c6;
    fconfig = (fdb_config *)auStack_610;
    pfStack_668 = (fdb_kvs_handle *)0x11c295;
    fdb_get_kvs_info(pfStack_658,(fdb_kvs_info *)fconfig);
    if (auStack_610._8_8_ != 3) {
      pfStack_668 = (fdb_kvs_handle *)0x11c2a6;
      in_memory_snapshot_rollback_test();
    }
    pfStack_668 = (fdb_kvs_handle *)0x11c2bc;
    fVar2 = fdb_snapshot_open(pfStack_658,&pfStack_638,0xffffffffffffffff);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3cb;
    pfStack_668 = (fdb_kvs_handle *)0x11c2e4;
    fdb_iterator_init(pfStack_638,&pfStack_648,(void *)0x0,0,(void *)0x0,0,0);
    fconfig = (fdb_config *)&pfStack_640;
    pfStack_640 = (fdb_doc *)0x0;
    fconfig_00 = (fdb_config *)0x3;
    do {
      pfStack_668 = (fdb_kvs_handle *)0x11c303;
      fVar2 = fdb_iterator_get(pfStack_648,(fdb_doc **)fconfig);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3a8;
      pfStack_668 = (fdb_kvs_handle *)0x11c315;
      fdb_doc_free(pfStack_640);
      pfStack_640 = (fdb_doc *)0x0;
      pfStack_668 = (fdb_kvs_handle *)0x11c328;
      fVar2 = fdb_iterator_next(pfStack_648);
      fconfig_00 = (fdb_config *)&fconfig_00[-1].field_0xf7;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (fconfig_00 == (fdb_config *)0x0) {
      pfStack_668 = (fdb_kvs_handle *)0x11c343;
      fdb_iterator_close(pfStack_648);
      pfStack_668 = (fdb_kvs_handle *)0x11c34d;
      fdb_kvs_close(pfStack_638);
      pfStack_668 = (fdb_kvs_handle *)0x11c357;
      fdb_close(pfStack_650);
      pfStack_668 = (fdb_kvs_handle *)0x11c35c;
      fdb_shutdown();
      pfStack_668 = (fdb_kvs_handle *)0x11c361;
      memleak_end();
      pcVar16 = "%s PASSED\n";
      if (in_memory_snapshot_rollback_test()::__test_pass != '\0') {
        pcVar16 = "%s FAILED\n";
      }
      pfStack_668 = (fdb_kvs_handle *)0x11c392;
      fprintf(_stderr,pcVar16,"in-memory snapshot rollback test");
      return;
    }
  }
  else {
LAB_0011c3ad:
    pfStack_668 = (fdb_kvs_handle *)0x11c3b2;
    in_memory_snapshot_rollback_test();
LAB_0011c3b2:
    pfStack_668 = (fdb_kvs_handle *)0x11c3b7;
    in_memory_snapshot_rollback_test();
LAB_0011c3b7:
    pfStack_668 = (fdb_kvs_handle *)0x11c3bc;
    in_memory_snapshot_rollback_test();
LAB_0011c3bc:
    pfStack_668 = (fdb_kvs_handle *)0x11c3c1;
    in_memory_snapshot_rollback_test();
LAB_0011c3c1:
    pfStack_668 = (fdb_kvs_handle *)0x11c3c6;
    in_memory_snapshot_rollback_test();
LAB_0011c3c6:
    pfStack_668 = (fdb_kvs_handle *)0x11c3cb;
    in_memory_snapshot_rollback_test();
LAB_0011c3cb:
    pfStack_668 = (fdb_kvs_handle *)0x11c3d0;
    in_memory_snapshot_rollback_test();
  }
  pfStack_668 = (fdb_kvs_handle *)rollback_drop_multi_files_kvs_test;
  in_memory_snapshot_rollback_test();
  pcStack_2b20 = (code *)0x11c3f2;
  pfStack_690 = fconfig;
  pfStack_688 = unaff_R12;
  pfStack_680 = unaff_R13;
  pfStack_678 = fconfig_00;
  pfStack_670 = unaff_R15;
  pfStack_668 = pfVar13;
  gettimeofday(&tStack_2aa8,(__timezone_ptr_t)0x0);
  pcStack_2b20 = (code *)0x11c3f7;
  memleak_start();
  pcStack_2b20 = (code *)0x11c403;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_2b20 = (code *)0x11c413;
  fdb_get_default_config();
  pcStack_2b20 = (code *)0x11c41d;
  fdb_get_default_kvs_config();
  fStack_2990.wal_threshold = 0x400;
  fStack_2990.compaction_mode = 0;
  fStack_2990.durability_opt = 2;
  pfVar7 = (fdb_kvs_handle *)(apfStack_2798 + 0x20);
  ppfVar9 = apfStack_2a98;
  pcVar16 = "kvs%d";
  uVar14 = 0;
  __s = (fdb_kvs_handle **)0x0;
  do {
    pcStack_2b20 = (code *)0x11c45d;
    sprintf((char *)ppfVar9,"mvcc_test%d",(ulong)__s & 0xffffffff);
    pcVar8 = (char *)(apfStack_2b08 + (long)__s);
    pcStack_2b20 = (code *)0x11c478;
    ppfVar17 = (fdb_kvs_handle **)pcVar8;
    fVar2 = fdb_open((fdb_file_handle **)pcVar8,(char *)ppfVar9,(fdb_config *)(apfStack_2a98 + 0x21)
                    );
    iVar4 = (int)ppfVar17;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7c7;
    ppfVar17 = (fdb_kvs_handle **)0x0;
    ppfStack_2b18 = __s;
    pfStack_2b10 = pfVar7;
    do {
      __s = ppfVar17;
      pcStack_2b20 = (code *)0x11c49d;
      sprintf((char *)ppfVar9,"kvs%d",(ulong)(uint)((int)__s + (int)uVar14));
      pfVar15 = *(fdb_kvs_handle **)pcVar8;
      pcStack_2b20 = (code *)0x11c4b0;
      fVar2 = fdb_kvs_open((fdb_file_handle *)pfVar15,(fdb_kvs_handle **)pfVar7,(char *)ppfVar9,
                           (fdb_kvs_config *)(apfStack_2b08 + 9));
      iVar4 = (int)pfVar15;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_2b20 = (code *)0x11c7bd;
        rollback_drop_multi_files_kvs_test();
        goto LAB_0011c7bd;
      }
      pfVar7 = (fdb_kvs_handle *)&(pfVar7->kvs_config).custom_cmp;
      ppfVar17 = (fdb_kvs_handle **)((long)__s + 1);
    } while ((char *)((long)__s + 1) != (char *)0x80);
    __s = (fdb_kvs_handle **)((long)ppfStack_2b18 + 1);
    uVar14 = uVar14 + 0x80;
    pfVar7 = (fdb_kvs_handle *)&pfStack_2b10[1].bub_ctx.space_used;
  } while (__s != (fdb_kvs_handle **)0x8);
  __s = apfStack_2a98 + 0x40;
  ppfVar9 = apfStack_2798;
  pfVar7 = (fdb_kvs_handle *)0x0;
  do {
    uVar14 = 0;
    do {
      pcStack_2b20 = (code *)0x11c511;
      sprintf((char *)__s,"key%08d",uVar14);
      pcStack_2b20 = (code *)0x11c524;
      sprintf((char *)ppfVar9,"value%08d",uVar14);
      pcVar16 = (char *)apfStack_2798[(long)&pfVar7->op_stats];
      pcStack_2b20 = (code *)0x11c534;
      sVar5 = strlen((char *)__s);
      pcVar8 = (char *)(sVar5 + 1);
      pcStack_2b20 = (code *)0x11c540;
      sVar5 = strlen((char *)ppfVar9);
      pcStack_2b20 = (code *)0x11c555;
      pfVar15 = (fdb_kvs_handle *)pcVar16;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar16,__s,(size_t)pcVar8,ppfVar9,sVar5 + 1);
      iVar4 = (int)pfVar15;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7bd;
      uVar11 = (int)uVar14 + 1;
      uVar14 = (ulong)uVar11;
    } while (uVar11 != 10);
    pfVar7 = (fdb_kvs_handle *)&(pfVar7->kvs_config).field_0x1;
  } while (pfVar7 != (fdb_kvs_handle *)0x400);
  pcVar8 = (char *)0x0;
  do {
    pfVar15 = apfStack_2b08[(long)pcVar8];
    if (((ulong)pcVar8 & 1) == 0) {
      pcStack_2b20 = (code *)0x11c583;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar15,'\0');
      iVar4 = (int)pfVar15;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7e5;
    }
    else {
      pcStack_2b20 = (code *)0x11c596;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar15,'\x01');
      iVar4 = (int)pfVar15;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7ea;
    }
    pcVar8 = (char *)((long)pcVar8 + 1);
  } while (pcVar8 != (char *)0x8);
  pcVar8 = "key%08d";
  __s = apfStack_2a98 + 0x40;
  ppfVar9 = (fdb_kvs_handle **)0x0;
  do {
    uVar14 = 0;
    do {
      pcStack_2b20 = (code *)0x11c5ca;
      sprintf((char *)__s,"key%08d",uVar14);
      pfVar7 = apfStack_2798[(long)(ppfVar9 + 4)];
      pcStack_2b20 = (code *)0x11c5da;
      sVar5 = strlen((char *)__s);
      pcStack_2b20 = (code *)0x11c5e9;
      pfVar15 = pfVar7;
      fVar2 = fdb_del_kv(pfVar7,__s,sVar5 + 1);
      iVar4 = (int)pfVar15;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7c2;
      uVar11 = (int)uVar14 + 1;
      uVar14 = (ulong)uVar11;
    } while (uVar11 != 10);
    ppfVar9 = (fdb_kvs_handle **)((long)ppfVar9 + 1);
  } while (ppfVar9 != (fdb_kvs_handle **)0x400);
  pcVar8 = (char *)0x0;
  do {
    pfVar15 = apfStack_2b08[(long)pcVar8];
    if (((ulong)pcVar8 & 1) == 0) {
      pcStack_2b20 = (code *)0x11c617;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar15,'\0');
      iVar4 = (int)pfVar15;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7ef;
    }
    else {
      pcStack_2b20 = (code *)0x11c62a;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar15,'\x01');
      iVar4 = (int)pfVar15;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7f4;
    }
    pcVar8 = (char *)((long)pcVar8 + 1);
  } while (pcVar8 != (char *)0x8);
  __s = (fdb_kvs_handle **)0xffffffffffffffc0;
  pcVar8 = (char *)(apfStack_2798 + 0x20);
  do {
    pcStack_2b20 = (code *)0x11c657;
    ppfVar17 = (fdb_kvs_handle **)pcVar8;
    fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar8,10);
    iVar4 = (int)ppfVar17;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7cc;
    __s = __s + 8;
    pcVar8 = (char *)((long)pcVar8 + 0x200);
  } while (__s < (fdb_kvs_handle **)0x3c0);
  ppfVar9 = apfStack_2b08;
  pcVar8 = "kvs%d";
  __s = apfStack_2a98;
  pfVar7 = (fdb_kvs_handle *)0x0;
  do {
    pfVar15 = apfStack_2798[(long)&pfVar7->op_stats];
    pcStack_2b20 = (code *)0x11c697;
    fVar2 = fdb_kvs_close(pfVar15);
    iVar4 = (int)pfVar15;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7d6;
    pcStack_2b20 = (code *)0x11c6af;
    sprintf((char *)__s,"kvs%d",(ulong)pfVar7 & 0xffffffff);
    pfVar15 = *ppfVar9;
    pcStack_2b20 = (code *)0x11c6bb;
    fVar2 = fdb_kvs_remove((fdb_file_handle *)pfVar15,(char *)__s);
    iVar4 = (int)pfVar15;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7d1;
    pfVar7 = (fdb_kvs_handle *)&(pfVar7->config).wal_threshold;
    ppfVar9 = ppfVar9 + 1;
  } while (pfVar7 != (fdb_kvs_handle *)0x400);
  pcVar8 = (char *)0x0;
  do {
    pfVar15 = apfStack_2b08[(long)pcVar8];
    if (((ulong)pcVar8 & 1) == 0) {
      pcStack_2b20 = (code *)0x11c6e7;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar15,'\0');
      iVar4 = (int)pfVar15;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7f9;
    }
    else {
      pcStack_2b20 = (code *)0x11c6fa;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar15,'\x01');
      iVar4 = (int)pfVar15;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7fe;
    }
    pcVar8 = (char *)((long)pcVar8 + 1);
  } while (pcVar8 != (char *)0x8);
  pcVar8 = "mvcc_test_compact%d";
  __s = apfStack_2a98;
  pfVar7 = (fdb_kvs_handle *)0x0;
  do {
    pcStack_2b20 = (code *)0x11c72d;
    sprintf((char *)__s,"mvcc_test_compact%d",(ulong)pfVar7 & 0xffffffff);
    pfVar15 = apfStack_2b08[(long)pfVar7];
    pcStack_2b20 = (code *)0x11c73a;
    fVar2 = fdb_compact((fdb_file_handle *)pfVar15,(char *)__s);
    iVar4 = (int)pfVar15;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7db;
    pfVar7 = (fdb_kvs_handle *)&(pfVar7->kvs_config).field_0x1;
  } while (pfVar7 != (fdb_kvs_handle *)0x8);
  pcVar8 = (char *)0x0;
  pcStack_2b20 = (code *)0x11c754;
  fdb_doc_free((fdb_doc *)0x0);
  while( true ) {
    pfVar15 = apfStack_2b08[(long)pcVar8];
    pcStack_2b20 = (code *)0x11c75e;
    fVar2 = fdb_close((fdb_file_handle *)pfVar15);
    iVar4 = (int)pfVar15;
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    pcVar8 = (char *)((long)pcVar8 + 1);
    if (pcVar8 == (char *)0x8) {
      pcStack_2b20 = (code *)0x11c770;
      fdb_shutdown();
      pcStack_2b20 = (code *)0x11c775;
      memleak_end();
      pcVar16 = "%s PASSED\n";
      if (rollback_drop_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar16 = "%s FAILED\n";
      }
      pcStack_2b20 = (code *)0x11c7a6;
      fprintf(_stderr,pcVar16,"open multi files kvs test");
      return;
    }
  }
LAB_0011c7e0:
  pcStack_2b20 = (code *)0x11c7e5;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7e5:
  pcStack_2b20 = (code *)0x11c7ea;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7ea:
  pcStack_2b20 = (code *)0x11c7ef;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7ef:
  pcStack_2b20 = (code *)0x11c7f4;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7f4:
  pcStack_2b20 = (code *)0x11c7f9;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7f9:
  pcStack_2b20 = (code *)0x11c7fe;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7fe:
  pcStack_2b20 = rollback_without_seqtree;
  rollback_drop_multi_files_kvs_test();
  pcStack_3028 = (code *)0x11c825;
  ppfStack_2b48 = (fdb_kvs_handle **)pcVar8;
  ppfStack_2b40 = ppfVar9;
  pfStack_2b38 = (fdb_kvs_handle *)pcVar16;
  ppfStack_2b30 = __s;
  pfStack_2b28 = pfVar7;
  pcStack_2b20 = (code *)uVar14;
  gettimeofday(&tStack_2fa0,(__timezone_ptr_t)0x0);
  pcStack_3028 = (code *)0x11c82a;
  memleak_start();
  pcStack_3028 = (code *)0x11c83a;
  fdb_get_default_config();
  pcStack_3028 = (code *)0x11c844;
  fdb_get_default_kvs_config();
  fStack_2c40.flags = 1;
  fStack_2c40.block_reusing_threshold = 0;
  fStack_2c40.seqtree_opt = 0;
  pcStack_3028 = (code *)0x11c86a;
  fStack_2c40.multi_kv_instances = (bool)(char)iVar4;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_3028 = (code *)0x11c87e;
  fdb_open((fdb_file_handle **)&pfStack_3010,"./mvcc_test1",(fdb_config *)(acStack_2d40 + 0x100));
  iStack_2fec = iVar4;
  if (iVar4 == 0) {
    pcStack_3028 = (code *)0x11c8ea;
    fdb_kvs_open_default((fdb_file_handle *)pfStack_3010,apfStack_2fe0,&fStack_2fc0);
    pcVar16 = (char *)0x1;
  }
  else {
    ppfVar9 = apfStack_2fe0;
    uVar14 = 0;
    do {
      pcStack_3028 = (code *)0x11c8af;
      sprintf(acStack_2fa8,"kv%d",uVar14 & 0xffffffff);
      pcStack_3028 = (code *)0x11c8c2;
      fdb_kvs_open((fdb_file_handle *)pfStack_3010,ppfVar9,acStack_2fa8,&fStack_2fc0);
      uVar14 = uVar14 + 1;
      ppfVar9 = ppfVar9 + 1;
    } while (uVar14 != 3);
    pcVar16 = (char *)0x3;
  }
  uStack_3014 = 0;
  do {
    uVar14 = 0;
    do {
      pcStack_3028 = (code *)0x11c916;
      sprintf(acStack_2e40,"key%d",uVar14 & 0xffffffff);
      pcStack_3028 = (code *)0x11c937;
      sprintf(acStack_2f90,"meta-%d-%d",(ulong)uStack_3014,uVar14 & 0xffffffff);
      pcStack_3028 = (code *)0x11c956;
      sprintf(acStack_2d40,"body-%d-%d",(ulong)uStack_3014,uVar14 & 0xffffffff);
      doc = (btree *)(&bStack_2e90.ksize + uVar14 * 8);
      pcStack_3028 = (code *)0x11c969;
      sVar5 = strlen(acStack_2e40);
      pcStack_3028 = (code *)0x11c979;
      metalen._M_i = strlen(acStack_2f90);
      pcStack_3028 = (code *)0x11c984;
      bodylen = strlen(acStack_2d40);
      pcStack_3028 = (code *)0x11c9a9;
      fdb_doc_create((fdb_doc **)doc,acStack_2e40,sVar5,acStack_2f90,metalen._M_i,acStack_2d40,
                     bodylen);
      pfVar7 = (fdb_kvs_handle *)0x0;
      do {
        pcStack_3028 = (code *)0x11c9ba;
        fdb_set(apfStack_2fe0[(long)pfVar7],*(fdb_doc **)doc);
        pfVar7 = (fdb_kvs_handle *)((long)pfVar7 + 1);
      } while ((fdb_kvs_handle *)pcVar16 != pfVar7);
      pcStack_3028 = (code *)0x11c9cf;
      fdb_doc_free(*(fdb_doc **)(&bStack_2e90.ksize + uVar14 * 8));
      uVar14 = uVar14 + 1;
    } while (uVar14 != 10);
    pcStack_3028 = (code *)0x11c9f3;
    fdb_commit((fdb_file_handle *)pfStack_3010,~(byte)uStack_3014 & 1);
    uStack_3014 = uStack_3014 + 1;
    pcVar8 = (char *)(ulong)uStack_3014;
  } while (uStack_3014 != 5);
  pcStack_3028 = (code *)0x11ca16;
  fVar2 = fdb_get_all_snap_markers((fdb_file_handle *)pfStack_3010,&pfStack_2ff8,&uStack_2fc8);
  pfVar15 = (fdb_kvs_handle *)0xa;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_3028 = (code *)0x11ca35;
    fVar2 = fdb_rollback(apfStack_2fe0,(pfStack_2ff8[3].kvs_markers)->seqnum);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd19;
    pfStack_3008 = (fdb_kvs_handle *)0x0;
    pcVar8 = acStack_2d40;
    pfVar15 = (fdb_kvs_handle *)0x0;
    do {
      pcStack_3028 = (code *)0x11ca6a;
      fVar2 = fdb_snapshot_open(apfStack_2fe0[(long)pfVar15],&pfStack_2fe8,0xffffffffffffffff);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccfb:
        pcStack_3028 = (code *)0x11cd00;
        rollback_without_seqtree();
LAB_0011cd00:
        pcStack_3028 = (code *)0x11cd05;
        rollback_without_seqtree();
LAB_0011cd05:
        pcStack_3028 = (code *)0x11cd0a;
        rollback_without_seqtree();
LAB_0011cd0a:
        pcStack_3028 = (code *)0x11cd0f;
        rollback_without_seqtree();
        goto LAB_0011cd0f;
      }
      pcStack_3028 = (code *)0x11ca92;
      fVar2 = fdb_iterator_init(pfStack_2fe8,&pfStack_3000,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccf6:
        pcStack_3028 = (code *)0x11ccfb;
        rollback_without_seqtree();
        goto LAB_0011ccfb;
      }
      metalen._M_i = 0;
      do {
        pcStack_3028 = (code *)0x11caac;
        fVar2 = fdb_iterator_get(pfStack_3000,(fdb_doc **)&pfStack_3008);
        if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccd1:
          pcStack_3028 = (code *)0x11ccd6;
          rollback_without_seqtree();
LAB_0011ccd6:
          pcStack_3028 = (code *)0x11cce6;
          rollback_without_seqtree();
LAB_0011cce6:
          pcStack_3028 = (code *)0x11ccf6;
          rollback_without_seqtree();
          goto LAB_0011ccf6;
        }
        pcStack_3028 = (code *)0x11cacd;
        sprintf(acStack_2e40,"key%d",metalen._M_i);
        if (pfVar15 == (fdb_kvs_handle *)0x0) {
          pcStack_3028 = (code *)0x11cb1c;
          sprintf(acStack_2f90,"meta-1-%d",metalen._M_i);
          pcStack_3028 = (code *)0x11cb30;
          sprintf(pcVar8,"body-1-%d",metalen._M_i);
        }
        else {
          pcStack_3028 = (code *)0x11caf0;
          sprintf(acStack_2f90,"meta-%d-%d",4,metalen._M_i);
          pcStack_3028 = (code *)0x11cb09;
          sprintf(pcVar8,"body-%d-%d",4);
        }
        pfVar7 = pfStack_3008;
        doc = (btree *)pfStack_3008->op_stats;
        pcStack_3028 = (code *)0x11cb4c;
        iVar4 = bcmp(doc,acStack_2e40,*(size_t *)&pfStack_3008->kvs_config);
        if (iVar4 != 0) {
          pcStack_3028 = (code *)0x11ccd1;
          rollback_without_seqtree();
          goto LAB_0011ccd1;
        }
        doc = pfVar7->staletree;
        pcStack_3028 = (code *)0x11cb6c;
        iVar4 = bcmp(doc,acStack_2f90,(size_t)(pfVar7->kvs_config).custom_cmp);
        if (iVar4 != 0) goto LAB_0011cce6;
        doc = (pfVar7->field_6).seqtree;
        pcStack_3028 = (code *)0x11cb87;
        iVar4 = bcmp(doc,pcVar8,(size_t)(pfVar7->kvs_config).custom_cmp_param);
        if (iVar4 != 0) goto LAB_0011ccd6;
        pcStack_3028 = (code *)0x11cb97;
        fdb_doc_free((fdb_doc *)pfVar7);
        pfStack_3008 = (fdb_kvs_handle *)0x0;
        uVar11 = (int)metalen._M_i + 1;
        metalen._M_i = (__int_type)uVar11;
        pcStack_3028 = (code *)0x11cbad;
        fVar2 = fdb_iterator_next(pfStack_3000);
      } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      if (uVar11 != 10) goto LAB_0011cd00;
      pcStack_3028 = (code *)0x11cbca;
      fVar2 = fdb_iterator_close(pfStack_3000);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd05;
      pcStack_3028 = (code *)0x11cbdc;
      fVar2 = fdb_kvs_close(pfStack_2fe8);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd0a;
      pfVar15 = (fdb_kvs_handle *)&(pfVar15->kvs_config).field_0x1;
    } while (pfVar15 != (fdb_kvs_handle *)pcVar16);
    pcVar8 = (char *)0x0;
    do {
      pcStack_3028 = (code *)0x11cbfc;
      fVar2 = fdb_kvs_close(apfStack_2fe0[(long)pcVar8]);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd0f;
      pcVar8 = pcVar8 + 1;
    } while (pcVar16 != pcVar8);
    pcStack_3028 = (code *)0x11cc1f;
    fVar2 = fdb_rollback_all((fdb_file_handle *)pfStack_3010,pfStack_2ff8[3].marker);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd1e;
    pcStack_3028 = (code *)0x11cc36;
    fVar2 = fdb_free_snap_markers(pfStack_2ff8,uStack_2fc8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_3028 = (code *)0x11cc48;
      fdb_close((fdb_file_handle *)pfStack_3010);
      pcStack_3028 = (code *)0x11cc4d;
      fdb_shutdown();
      pcStack_3028 = (code *)0x11cc52;
      memleak_end();
      pcVar16 = "single kv mode:";
      if ((char)iStack_2fec != '\0') {
        pcVar16 = "multiple kv mode:";
      }
      pcStack_3028 = (code *)0x11cc82;
      sprintf(acStack_2d40,"rollback without seqtree in %s",pcVar16);
      pcVar16 = "%s PASSED\n";
      if (rollback_without_seqtree(bool)::__test_pass != '\0') {
        pcVar16 = "%s FAILED\n";
      }
      pcStack_3028 = (code *)0x11ccaf;
      fprintf(_stderr,pcVar16,acStack_2d40);
      return;
    }
  }
  else {
LAB_0011cd14:
    pcStack_3028 = (code *)0x11cd19;
    rollback_without_seqtree();
LAB_0011cd19:
    pcStack_3028 = (code *)0x11cd1e;
    rollback_without_seqtree();
LAB_0011cd1e:
    pcStack_3028 = (code *)0x11cd23;
    rollback_without_seqtree();
  }
  pcStack_3028 = tx_crash_recover_test;
  rollback_without_seqtree();
  pfStack_3200 = (fdb_kvs_handle *)0x11cd45;
  pcStack_3050 = pcVar8;
  aStack_3048.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)metalen._M_i;
  pbStack_3040 = doc;
  pfStack_3038 = pfVar7;
  pfStack_3030 = pfVar15;
  pcStack_3028 = (code *)pcVar16;
  gettimeofday(&tStack_31a0,(__timezone_ptr_t)0x0);
  pfStack_3200 = (fdb_kvs_handle *)0x11cd4a;
  memleak_start();
  pfStack_3200 = (fdb_kvs_handle *)0x11cd56;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcVar16 = auStack_3190 + 0x48;
  pfStack_3200 = (fdb_kvs_handle *)0x11cd66;
  fdb_get_default_config();
  pfStack_3200 = (fdb_kvs_handle *)0x11cd78;
  fVar2 = fdb_open(&pfStack_31f8,"./mvcc_test2",(fdb_config *)pcVar16);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar16 = auStack_3190;
    pfStack_3200 = (fdb_kvs_handle *)0x11cd8d;
    fdb_get_default_kvs_config();
    pbStack_31a8 = (btreeblk_handle *)auStack_3190._16_8_;
    pfStack_31b8 = (filemgr *)auStack_3190._0_8_;
    pdStack_31b0 = (docio_handle *)auStack_3190._8_8_;
    pfStack_3200 = (fdb_kvs_handle *)0x11cdae;
    fVar2 = fdb_kvs_open_default(pfStack_31f8,&pfStack_31f0,(fdb_kvs_config *)&pfStack_31b8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0b9;
    pfStack_3200 = (fdb_kvs_handle *)0x11cdc4;
    fVar2 = fdb_begin_transaction(pfStack_31f8,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0be;
    pcVar16 = "key%d";
    pfVar7 = (fdb_kvs_handle *)acStack_31e7;
    pfVar15 = (fdb_kvs_handle *)0x1555bd;
    uVar14 = 0;
    do {
      pfStack_3200 = (fdb_kvs_handle *)0x11cdf0;
      sprintf((char *)pfVar7,"key%d",uVar14);
      pfVar13 = pfStack_31f0;
      pfStack_3200 = (fdb_kvs_handle *)0x11cdfd;
      sVar5 = strlen((char *)pfVar7);
      pfStack_3200 = (fdb_kvs_handle *)0x11ce14;
      fVar2 = fdb_set_kv(pfVar13,pfVar7,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_3200 = (fdb_kvs_handle *)0x11d0a5;
        tx_crash_recover_test();
        goto LAB_0011d0a5;
      }
      uVar11 = (int)uVar14 + 1;
      uVar14 = (ulong)uVar11;
    } while (uVar11 != 10);
    pfStack_3200 = (fdb_kvs_handle *)0x11ce31;
    fVar2 = fdb_end_transaction(pfStack_31f8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0c3;
    pfStack_3200 = (fdb_kvs_handle *)0x11ce49;
    fdb_compact(pfStack_31f8,"./mvcc_test3");
    pfStack_3200 = (fdb_kvs_handle *)0x11ce57;
    fVar2 = fdb_begin_transaction(pfStack_31f8,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0c8;
    pcVar16 = "key%d";
    pfVar7 = (fdb_kvs_handle *)acStack_31e7;
    uVar11 = 0;
    do {
      pfStack_3200 = (fdb_kvs_handle *)0x11ce7c;
      sprintf((char *)pfVar7,"key%d",(ulong)uVar11);
      pfVar15 = pfStack_31f0;
      pfStack_3200 = (fdb_kvs_handle *)0x11ce89;
      sVar5 = strlen((char *)pfVar7);
      pfStack_3200 = (fdb_kvs_handle *)0x11ce97;
      fVar2 = fdb_del_kv(pfVar15,pfVar7,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0a5;
      uVar11 = uVar11 + 1;
    } while (uVar11 != 10);
    pfStack_3200 = (fdb_kvs_handle *)0x11ceb4;
    fVar2 = fdb_get_file_info(pfStack_31f8,(fdb_file_info *)auStack_3190);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0cd;
    pcVar16 = (char *)((ulong)auStack_3190._40_8_ / (ulong)uStack_3144);
    pfStack_3200 = (fdb_kvs_handle *)0x11cedc;
    fdb_close(pfStack_31f8);
    pfStack_3200 = (fdb_kvs_handle *)0x11cee1;
    fdb_shutdown();
    pfStack_3200 = (fdb_kvs_handle *)0x11cf00;
    iVar4 = _disk_dump("./mvcc_test3",(ulong)uStack_3144 * (long)pcVar16,
                       (ulong)((uStack_3144 >> 2) + uStack_3144 * 2));
    if (iVar4 < 0) goto LAB_0011d0d2;
    pfStack_3200 = (fdb_kvs_handle *)0x11cf2a;
    iVar4 = _disk_dump("./mvcc_test2",((long)pcVar16 * 4 + 8) * (ulong)uStack_3144,
                       (ulong)(uStack_3144 >> 2));
    if (iVar4 < 0) goto LAB_0011d0d7;
    pfStack_3200 = (fdb_kvs_handle *)0x11cf49;
    fVar2 = fdb_open(&pfStack_31f8,"./mvcc_test3",(fdb_config *)(auStack_3190 + 0x48));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0dc;
    pcVar16 = (char *)&pfStack_31d8;
    pfStack_3200 = (fdb_kvs_handle *)0x11cf5e;
    fdb_get_default_kvs_config();
    pbStack_31a8 = pbStack_31c8;
    pfStack_31b8 = pfStack_31d8;
    pdStack_31b0 = pdStack_31d0;
    pfStack_3200 = (fdb_kvs_handle *)0x11cf7f;
    fVar2 = fdb_kvs_open_default(pfStack_31f8,&pfStack_31f0,(fdb_kvs_config *)&pfStack_31b8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0e1;
    pfStack_3200 = (fdb_kvs_handle *)0x11cf95;
    fVar2 = fdb_begin_transaction(pfStack_31f8,'\x03');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      uVar11 = 0;
      do {
        pfStack_3200 = (fdb_kvs_handle *)0x11cfba;
        sprintf(acStack_31e7,"key%d",(ulong)uVar11);
        pfVar15 = pfStack_31f0;
        pfStack_3200 = (fdb_kvs_handle *)0x11cfc7;
        sVar5 = strlen(acStack_31e7);
        pfStack_3200 = (fdb_kvs_handle *)0x11cfd5;
        fVar2 = fdb_del_kv(pfVar15,acStack_31e7,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0aa;
        uVar11 = uVar11 + 1;
      } while (uVar11 != 10);
      pfStack_3200 = (fdb_kvs_handle *)0x11cfed;
      fdb_abort_transaction(pfStack_31f8);
      pfVar15 = (fdb_kvs_handle *)&pfStack_31d8;
      uVar11 = 0;
      while( true ) {
        pfStack_3200 = (fdb_kvs_handle *)0x11d014;
        sprintf(acStack_31e7,"key%d",(ulong)uVar11);
        pfVar7 = pfStack_31f0;
        pfStack_3200 = (fdb_kvs_handle *)0x11d021;
        sVar5 = strlen(acStack_31e7);
        pfStack_3200 = (fdb_kvs_handle *)0x11d035;
        fVar2 = fdb_get_kv(pfVar7,acStack_31e7,sVar5,(void **)pfVar15,&sStack_31c0);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        pfStack_3200 = (fdb_kvs_handle *)0x11d043;
        free(pfStack_31d8);
        uVar11 = uVar11 + 1;
        if (uVar11 == 10) {
          pfStack_3200 = (fdb_kvs_handle *)0x11d053;
          fdb_close(pfStack_31f8);
          pfStack_3200 = (fdb_kvs_handle *)0x11d058;
          fdb_shutdown();
          pfStack_3200 = (fdb_kvs_handle *)0x11d05d;
          memleak_end();
          pcVar16 = "%s PASSED\n";
          if (tx_crash_recover_test()::__test_pass != '\0') {
            pcVar16 = "%s FAILED\n";
          }
          pfStack_3200 = (fdb_kvs_handle *)0x11d08e;
          fprintf(_stderr,pcVar16,"crash recover test");
          return;
        }
      }
LAB_0011d0af:
      pfVar7 = (fdb_kvs_handle *)acStack_31e7;
      pcVar16 = "key%d";
      pfStack_3200 = (fdb_kvs_handle *)0x11d0b4;
      tx_crash_recover_test();
      goto LAB_0011d0b4;
    }
  }
  else {
LAB_0011d0b4:
    pfStack_3200 = (fdb_kvs_handle *)0x11d0b9;
    tx_crash_recover_test();
LAB_0011d0b9:
    pfStack_3200 = (fdb_kvs_handle *)0x11d0be;
    tx_crash_recover_test();
LAB_0011d0be:
    pfStack_3200 = (fdb_kvs_handle *)0x11d0c3;
    tx_crash_recover_test();
LAB_0011d0c3:
    pfStack_3200 = (fdb_kvs_handle *)0x11d0c8;
    tx_crash_recover_test();
LAB_0011d0c8:
    pfStack_3200 = (fdb_kvs_handle *)0x11d0cd;
    tx_crash_recover_test();
LAB_0011d0cd:
    pfStack_3200 = (fdb_kvs_handle *)0x11d0d2;
    tx_crash_recover_test();
LAB_0011d0d2:
    pfStack_3200 = (fdb_kvs_handle *)0x11d0d7;
    tx_crash_recover_test();
LAB_0011d0d7:
    pfStack_3200 = (fdb_kvs_handle *)0x11d0dc;
    tx_crash_recover_test();
LAB_0011d0dc:
    pfStack_3200 = (fdb_kvs_handle *)0x11d0e1;
    tx_crash_recover_test();
LAB_0011d0e1:
    pfStack_3200 = (fdb_kvs_handle *)0x11d0e6;
    tx_crash_recover_test();
  }
  pfStack_3200 = (fdb_kvs_handle *)drop_kv_on_snap_iterator_test;
  tx_crash_recover_test();
  pfStack_3210 = (fdb_config *)pcVar16;
  pfStack_3208 = pfVar7;
  pfStack_3200 = pfVar15;
  gettimeofday(&tStack_3330,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  pfStack_3340 = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&pfStack_3350,"./mvcc_test1",&fStack_3308);
  fdb_kvs_open_default(pfStack_3350,&pfStack_3338,&fStack_3320);
  fdb_kvs_open(pfStack_3350,&pfStack_3358,"kv",&fStack_3320);
  fVar2 = fdb_set_kv(pfStack_3358,"a",1,(void *)0x0,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_set_kv(pfStack_3358,"b",1,(void *)0x0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d304;
    fdb_commit(pfStack_3350,'\x01');
    fVar2 = fdb_snapshot_open(pfStack_3358,&pfStack_3360,2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d30b;
    fVar2 = fdb_iterator_init(pfStack_3360,&pfStack_3348,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d310;
    fVar2 = fdb_kvs_close(pfStack_3360);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d315;
    fVar2 = fdb_kvs_close(pfStack_3358);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d31a;
    fVar2 = fdb_kvs_remove(pfStack_3350,"kv");
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d31f;
    fVar2 = fdb_iterator_get(pfStack_3348,&pfStack_3340);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d324;
    fdb_doc_free(pfStack_3340);
    fVar2 = fdb_iterator_close(pfStack_3348);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d329;
    fVar2 = fdb_kvs_close(pfStack_3360);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d32e;
    fVar2 = fdb_kvs_close(pfStack_3338);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_close(pfStack_3350);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        pcVar16 = "%s PASSED\n";
        if (drop_kv_on_snap_iterator_test()::__test_pass != '\0') {
          pcVar16 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar16,"drop kv other handle test");
        return;
      }
      goto LAB_0011d338;
    }
  }
  else {
    drop_kv_on_snap_iterator_test();
LAB_0011d304:
    drop_kv_on_snap_iterator_test();
LAB_0011d30b:
    drop_kv_on_snap_iterator_test();
LAB_0011d310:
    drop_kv_on_snap_iterator_test();
LAB_0011d315:
    drop_kv_on_snap_iterator_test();
LAB_0011d31a:
    drop_kv_on_snap_iterator_test();
LAB_0011d31f:
    drop_kv_on_snap_iterator_test();
LAB_0011d324:
    drop_kv_on_snap_iterator_test();
LAB_0011d329:
    drop_kv_on_snap_iterator_test();
LAB_0011d32e:
    drop_kv_on_snap_iterator_test();
  }
  drop_kv_on_snap_iterator_test();
LAB_0011d338:
  drop_kv_on_snap_iterator_test();
  concurrent_writer_iterator_test();
  in_memory_snapshot_cleanup_test();
  drop_kv_on_snap_iterator_test();
  rollback_secondary_kvs();
  multi_version_test();
  crash_recovery_test(true);
  crash_recovery_test(false);
  snapshot_test();
  in_memory_snapshot_rollback_test();
  in_memory_snapshot_test();
  in_memory_snapshot_on_dirty_hbtrie_test();
  in_memory_snapshot_compaction_test();
  snapshot_clone_test();
  snapshot_parallel_clone_test();
  snapshot_stats_test();
  snapshot_with_uncomitted_data_test();
  snapshot_markers_in_file_test(true);
  snapshot_markers_in_file_test(false);
  snapshot_with_deletes_test();
  snapshot_without_seqtree(true);
  snapshot_without_seqtree(false);
  rollback_during_ops_test((void *)0x0);
  rollback_forward_seqnum();
  rollback_test(false);
  rollback_test(true);
  rollback_and_snapshot_test();
  rollback_ncommits();
  transaction_test();
  transaction_simple_api_test();
  transaction_in_memory_snapshot_test();
  rollback_prior_to_ops(true);
  rollback_prior_to_ops(false);
  snapshot_concurrent_compaction_test();
  rollback_to_zero_test(true);
  rollback_to_zero_test(false);
  rollback_to_zero_after_compact_test(false);
  rollback_to_zero_after_compact_test(true);
  rollback_all_test(true);
  rollback_all_test(false);
  rollback_to_wal_test(true);
  rollback_to_wal_test(false);
  rollback_drop_multi_files_kvs_test();
  rollback_without_seqtree(true);
  rollback_without_seqtree(false);
  tx_crash_recover_test();
  auto_compaction_snapshots_test();
  return;
}

Assistant:

void auto_compaction_snapshots_test()
{
    TEST_INIT();

    memleak_start();

    fdb_file_handle *file;
    fdb_kvs_handle *kvs, *snapshot;
    fdb_status status;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_seqnum_t seqnum;
    fdb_kvs_info info;
    fdb_doc *rdoc;
    int num_compactions = 0;
    char str[64];

    int i, r;

    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    // Open Database File
    config = fdb_get_default_config();
    config.compaction_mode = FDB_COMPACTION_AUTO;
    config.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    config.compaction_cb = compaction_cb_count;
    config.compaction_cb_ctx = &num_compactions;
    config.compaction_cb_mask = FDB_CS_COMPLETE;
    config.compactor_sleep_duration=1;
    status = fdb_open(&file, "mvcc_test1", &config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Open KV Store
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_kvs_open_default(file, &kvs, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Several kv pairs
    for(i=0;i<100000;i++) {
        sprintf(str, "%d", i);
        status = fdb_set_kv(kvs, str, strlen(str), (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // Every 10 Commit
        if (i % 10 == 0) {
            status = fdb_commit(file, FDB_COMMIT_NORMAL);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }

        // Every 100 iterations Get Seq/Snapshot
        if (i % 100 == 0) {
            status = fdb_get_kvs_info(kvs, &info);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            seqnum = info.last_seqnum;
            // Open durable snapshot in the midst of compaction..
            status = fdb_snapshot_open(kvs, &snapshot, seqnum);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            // verify last doc set is captured in snapshot..
            fdb_doc_create(&rdoc, NULL, 0, NULL, 0, NULL, 0);
            rdoc->seqnum = seqnum;
            status = fdb_get_byseq(snapshot, rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->key, str, strlen(str));
            // free result document
            fdb_doc_free(rdoc);
            status = fdb_kvs_close(snapshot);
            TEST_CHK(status == FDB_RESULT_SUCCESS);

            // Open in-memory snapshot and verify content
            status = fdb_snapshot_open(kvs, &snapshot, FDB_SNAPSHOT_INMEM);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            // verify last doc set is captured in snapshot..
            fdb_doc_create(&rdoc, NULL, 0, NULL, 0, NULL, 0);
            rdoc->seqnum = seqnum;
            status = fdb_get_byseq(snapshot, rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->key, str, strlen(str));
            // free result document
            fdb_doc_free(rdoc);
            status = fdb_kvs_close(snapshot);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    status = fdb_close(file);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_shutdown();
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    memleak_end();

    sprintf(str, "auto compaction completed %d times with snapshots",
            num_compactions);
    TEST_RESULT(str);
}